

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall Mesh::exportMESH(Mesh *this,string *filePath)

{
  pointer ppNVar1;
  Node *pNVar2;
  pointer ppTVar3;
  Tetrahedron *pTVar4;
  ostream *poVar5;
  pointer ppTVar6;
  pointer ppNVar7;
  ofstream file;
  
  std::ofstream::ofstream((ostream *)&file,(string *)filePath,_S_out);
  std::operator<<((ostream *)&file,"MeshVersionFormatted 2\n");
  std::operator<<((ostream *)&file,"Dimension\n         3\n");
  std::operator<<((ostream *)&file,"Vertices\n");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
  std::operator<<(poVar5,"\n");
  ppNVar1 = (this->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar7 = (this->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar7 != ppNVar1; ppNVar7 = ppNVar7 + 1) {
    pNVar2 = *ppNVar7;
    poVar5 = std::ostream::_M_insert<double>((pNVar2->pos).xyz._M_elems[0]);
    std::operator<<(poVar5,"  ");
    poVar5 = std::ostream::_M_insert<double>((pNVar2->pos).xyz._M_elems[1]);
    std::operator<<(poVar5,"  ");
    poVar5 = std::ostream::_M_insert<double>((pNVar2->pos).xyz._M_elems[2]);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pNVar2->label);
    std::operator<<(poVar5,"\n");
  }
  std::operator<<((ostream *)&file,"Tetrahedra\n");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
  std::operator<<(poVar5,"\n");
  ppTVar3 = (this->tetrahedrons).super__Vector_base<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppTVar6 = (this->tetrahedrons).
                 super__Vector_base<Tetrahedron_*,_std::allocator<Tetrahedron_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar6 != ppTVar3; ppTVar6 = ppTVar6 + 1) {
    pTVar4 = *ppTVar6;
    poVar5 = (ostream *)
             std::ostream::operator<<((ostream *)&file,(pTVar4->nodes)._M_elems[0]->index + 1);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pTVar4->nodes)._M_elems[1]->index + 1);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pTVar4->nodes)._M_elems[2]->index + 1);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pTVar4->nodes)._M_elems[3]->index + 1);
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,pTVar4->label);
    std::operator<<(poVar5,"\n");
  }
  std::operator<<((ostream *)&file,"End\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Mesh::exportMESH(const std::string &filePath){
    std::ofstream file(filePath);
    file << "MeshVersionFormatted 2\n";
    file << "Dimension\n         3\n";

    file << "Vertices\n";
    file << nodes.size() << "\n";
    for(auto n:nodes){
        file << n->pos[0] 
        << "  " << n->pos[1] 
        << "  " << n->pos[2]
        << "  " << n->label <<"\n";
    }

    file << "Tetrahedra\n";
    file << tetrahedrons.size() << "\n";
    for(auto e: tetrahedrons){
        file << e->nodes[0]->index + 1
        << "  " << e->nodes[1]->index + 1
        << "  " << e->nodes[2]->index + 1
        << "  " << e->nodes[3]->index + 1
        << "  " << e->label << "\n"; 
    }

    file << "End\n";
    file.close();
}